

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

void __thiscall
GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<4UL>::SymDiffSplice
          (Geobucket<4UL> *this,MP<6UL,_GF2::MOGrevlex<6UL>_> *polyRight)

{
  pointer puVar1;
  long lVar2;
  long lVar3;
  pointer pMVar4;
  long lVar5;
  long lVar6;
  
  lVar3 = 0;
  for (lVar5 = 1;
      puVar1 = (this->_maxsizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,
      puVar1[lVar5 + -1] <
      (polyRight->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
      super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node._M_size;
      lVar5 = lVar5 + 1) {
    if (lVar5 == (long)(this->_maxsizes).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar1 >> 3) {
      NewBucket(this);
    }
    lVar3 = lVar3 + 0x20;
  }
  MP<6UL,_GF2::MOGrevlex<6UL>_>::SymDiffSplice
            ((MP<6UL,_GF2::MOGrevlex<6UL>_> *)
             ((long)&(((this->_buckets).
                       super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
                     super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + lVar3),
             polyRight);
  lVar6 = -lVar3;
  lVar2 = lVar3;
  while( true ) {
    pMVar4 = (this->_buckets).
             super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->_maxsizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (*(ulong *)((long)&(pMVar4->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
                          super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> +
                  lVar3 + 0x10) <= puVar1[lVar5 + -1]) break;
    if (lVar5 == (long)(this->_maxsizes).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar1 >> 3) {
      NewBucket(this);
      pMVar4 = (this->_buckets).
               super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    MP<6UL,_GF2::MOGrevlex<6UL>_>::SymDiffSplice
              ((MP<6UL,_GF2::MOGrevlex<6UL>_> *)
               ((long)&(pMVar4->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
                       super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + lVar3),
               (MP<6UL,_GF2::MOGrevlex<6UL>_> *)
               ((long)&pMVar4[1].super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                       super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + lVar2));
    std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::clear
              ((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)
               ((long)&(this->_buckets).
                       super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].
                       super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                       super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + lVar2));
    lVar6 = lVar6 + -0x20;
    lVar5 = lVar5 + 1;
    lVar2 = lVar2 + 0x20;
  }
  std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::swap
            ((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)((long)pMVar4 - lVar6),
             (list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)
             ((long)&(pMVar4->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
                     super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> + lVar3));
  return;
}

Assistant:

void SymDiffSplice(MP& polyRight)
		{
			// поиск подходящей корзины 
			size_t i = 0, j;
			for (; polyRight.Size() > _maxsizes[i];)
				// корзины закончились?
				if (++i == _maxsizes.size()) NewBucket();
			// добавляем мономы в найденную корзину
			_buckets[j = i].SymDiffSplice(polyRight);
			while (_buckets[j].Size() > _maxsizes[i])
			{
				// корзины закончились?
				if (i + 1 == _maxsizes.size()) NewBucket();
				// перераспределяем мономы по корзинам 
				_buckets[j].SymDiffSplice(_buckets[++i]);
				_buckets[i].SetEmpty();
			}
			// меняем содержимое i-й и j-й корзин
			_buckets[i].Swap(_buckets[j]);
		}